

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O2

void replay_set_logfile(int logfd)

{
  boolean bVar1;
  
  if ((program_state.restoring == 0) && (logfile != 0)) {
    log_finish(LS_IN_PROGRESS);
  }
  bVar1 = lock_fd(logfd,1);
  if (bVar1 != '\0') {
    logfile = logfd;
    return;
  }
  raw_printf("The game log is locked by another DynaMoHack process. Aborting.");
  terminate();
}

Assistant:

void replay_set_logfile(int logfd)
{
    if (!program_state.restoring && logfile)
	log_finish(LS_IN_PROGRESS);
    
    if (!lock_fd(logfd, 1)) {
	raw_printf("The game log is locked by another DynaMoHack process. Aborting.");
	terminate();
    }
    logfile = logfd;
}